

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::get_curv_edge_vert_flips
          (Omega_h *this,Mesh *mesh,Adj *curv_verts2edges,LOs *edge2curv_edge)

{
  int *piVar1;
  int iVar2;
  LOs *pLVar3;
  Alloc *pAVar4;
  LO LVar5;
  long lVar6;
  long lVar7;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar8;
  Read<signed_char> RVar9;
  Write<signed_char> out;
  type f;
  Read<signed_char> in;
  Write<signed_char> local_188;
  Adj local_178;
  Alloc *local_148;
  void *local_140;
  Alloc *local_138;
  long local_130;
  Write<signed_char> local_128;
  Adj local_118;
  Alloc *local_e8;
  void *local_e0;
  Alloc *local_d8;
  long local_d0;
  LOs local_c8;
  Alloc *local_b8;
  long local_b0;
  Adj local_a8;
  Alloc *local_78;
  void *pvStack_70;
  Alloc *local_68;
  long lStack_60;
  Adj local_58;
  
  local_58.super_Graph.a2ab.write_.shared_alloc_.alloc =
       (curv_verts2edges->super_Graph).a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_58.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58.super_Graph.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_58.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
       (curv_verts2edges->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
  local_58.super_Graph.ab2b.write_.shared_alloc_.alloc =
       (curv_verts2edges->super_Graph).ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_58.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58.super_Graph.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_58.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
       (curv_verts2edges->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
  local_58.codes.write_.shared_alloc_.alloc = (curv_verts2edges->codes).write_.shared_alloc_.alloc;
  if (((ulong)local_58.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58.codes.write_.shared_alloc_.alloc =
           (Alloc *)((local_58.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.codes.write_.shared_alloc_.alloc)->use_count =
           (local_58.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_58.codes.write_.shared_alloc_.direct_ptr =
       (curv_verts2edges->codes).write_.shared_alloc_.direct_ptr;
  local_c8.write_.shared_alloc_.alloc = (edge2curv_edge->write_).shared_alloc_.alloc;
  if (((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8.write_.shared_alloc_.alloc =
           (Alloc *)((local_c8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_c8.write_.shared_alloc_.alloc)->use_count =
           (local_c8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_c8.write_.shared_alloc_.direct_ptr = (edge2curv_edge->write_).shared_alloc_.direct_ptr;
  get_curv_vert_edge_flips((Omega_h *)&local_b8,&local_58,&local_c8);
  pAVar4 = local_c8.write_.shared_alloc_.alloc;
  if (((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_c8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_c8.write_.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
    }
  }
  Adj::~Adj(&local_58);
  LVar5 = Mesh::nedges(mesh);
  pLVar3 = &local_178.super_Graph.ab2b;
  local_178.super_Graph.a2ab.write_.shared_alloc_.alloc = (Alloc *)pLVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"");
  Write<signed_char>::Write(&local_188,LVar5 * 2,'\0',(string *)&local_178);
  if (local_178.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)pLVar3) {
    operator_delete(local_178.super_Graph.a2ab.write_.shared_alloc_.alloc,
                    (ulong)((long)&(local_178.super_Graph.ab2b.write_.shared_alloc_.alloc)->size + 1
                           ));
  }
  LVar5 = Graph::nnodes(&curv_verts2edges->super_Graph);
  local_118.super_Graph.a2ab.write_.shared_alloc_.alloc =
       (curv_verts2edges->super_Graph).a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_118.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_118.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_118.super_Graph.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((local_118.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_118.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_118.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_118.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
       (curv_verts2edges->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
  local_118.super_Graph.ab2b.write_.shared_alloc_.alloc =
       (curv_verts2edges->super_Graph).ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_118.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_118.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_118.super_Graph.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((local_118.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_118.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_118.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_118.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
       (curv_verts2edges->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
  local_118.codes.write_.shared_alloc_.alloc = (curv_verts2edges->codes).write_.shared_alloc_.alloc;
  if (((ulong)local_118.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_118.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_118.codes.write_.shared_alloc_.alloc =
           (Alloc *)((local_118.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_118.codes.write_.shared_alloc_.alloc)->use_count =
           (local_118.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_118.codes.write_.shared_alloc_.direct_ptr =
       (curv_verts2edges->codes).write_.shared_alloc_.direct_ptr;
  local_e8 = local_188.shared_alloc_.alloc;
  if (((ulong)local_188.shared_alloc_.alloc & 7) == 0 &&
      local_188.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8 = (Alloc *)((local_188.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_188.shared_alloc_.alloc)->use_count = (local_188.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_e0 = local_188.shared_alloc_.direct_ptr;
  local_d8 = local_b8;
  if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8 = (Alloc *)(local_b8->size * 8 + 1);
    }
    else {
      local_b8->use_count = local_b8->use_count + 1;
    }
  }
  local_d0 = local_b0;
  local_a8.super_Graph.a2ab.write_.shared_alloc_.alloc =
       local_118.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_118.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_118.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8.super_Graph.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((local_118.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_118.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_118.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a8.super_Graph.ab2b.write_.shared_alloc_.alloc =
       local_118.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_118.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_118.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8.super_Graph.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((local_118.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_118.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_118.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a8.codes.write_.shared_alloc_.alloc = local_118.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_118.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_118.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8.codes.write_.shared_alloc_.alloc =
           (Alloc *)((local_118.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_118.codes.write_.shared_alloc_.alloc)->use_count =
           (local_118.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_78 = local_e8;
  if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78 = (Alloc *)(local_e8->size * 8 + 1);
    }
    else {
      local_e8->use_count = local_e8->use_count + 1;
    }
  }
  pvStack_70 = local_188.shared_alloc_.direct_ptr;
  local_68 = local_d8;
  if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68 = (Alloc *)(local_d8->size * 8 + 1);
    }
    else {
      local_d8->use_count = local_d8->use_count + 1;
    }
  }
  lStack_60 = local_b0;
  local_a8.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
       local_118.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_a8.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
       local_118.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_a8.codes.write_.shared_alloc_.direct_ptr = local_118.codes.write_.shared_alloc_.direct_ptr;
  if (0 < LVar5) {
    local_178.super_Graph.a2ab.write_.shared_alloc_.alloc =
         local_a8.super_Graph.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_a8.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_a8.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      (local_a8.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_a8.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + -1;
      local_178.super_Graph.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((local_a8.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_a8.super_Graph.a2ab.write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_a8.super_Graph.a2ab.write_.shared_alloc_.direct_ptr = (void *)0x0;
    local_178.super_Graph.ab2b.write_.shared_alloc_.alloc =
         local_a8.super_Graph.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_a8.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_a8.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      (local_a8.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_a8.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + -1;
      local_178.super_Graph.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((local_a8.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_a8.super_Graph.ab2b.write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_a8.super_Graph.ab2b.write_.shared_alloc_.direct_ptr = (void *)0x0;
    local_178.codes.write_.shared_alloc_.alloc = local_a8.codes.write_.shared_alloc_.alloc;
    if (((ulong)local_a8.codes.write_.shared_alloc_.alloc & 7) == 0 &&
        local_a8.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      (local_a8.codes.write_.shared_alloc_.alloc)->use_count =
           (local_a8.codes.write_.shared_alloc_.alloc)->use_count + -1;
      local_178.codes.write_.shared_alloc_.alloc =
           (Alloc *)((local_a8.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_a8.codes.write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_a8.codes.write_.shared_alloc_.direct_ptr = (void *)0x0;
    local_148 = local_78;
    local_140 = local_188.shared_alloc_.direct_ptr;
    if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
      local_78->use_count = local_78->use_count + -1;
      local_148 = (Alloc *)(local_78->size * 8 + 1);
    }
    local_78 = (Alloc *)0x0;
    pvStack_70 = (void *)0x0;
    local_138 = local_68;
    local_130 = local_b0;
    if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
      local_68->use_count = local_68->use_count + -1;
      local_138 = (Alloc *)(local_68->size * 8 + 1);
    }
    pAVar4 = local_138;
    local_68 = (Alloc *)0x0;
    lStack_60 = 0;
    entering_parallel = '\0';
    lVar6 = 0;
    do {
      iVar2 = *(int *)((long)local_118.super_Graph.a2ab.write_.shared_alloc_.direct_ptr + lVar6 * 4)
      ;
      lVar7 = (long)iVar2;
      if (iVar2 < *(int *)((long)local_118.super_Graph.a2ab.write_.shared_alloc_.direct_ptr +
                          lVar6 * 4 + 4)) {
        do {
          *(undefined1 *)
           ((long)local_188.shared_alloc_.direct_ptr +
           (long)(*(char *)((long)local_118.codes.write_.shared_alloc_.direct_ptr + lVar7) >> 3) +
           (long)*(int *)((long)local_118.super_Graph.ab2b.write_.shared_alloc_.direct_ptr +
                         lVar7 * 4) * 2) = *(undefined1 *)(local_b0 + lVar7);
          lVar7 = lVar7 + 1;
        } while (lVar7 < *(int *)((long)local_118.super_Graph.a2ab.write_.shared_alloc_.direct_ptr +
                                 lVar6 * 4 + 4));
      }
      lVar6 = lVar6 + 1;
    } while (LVar5 != (int)lVar6);
    local_178.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
         local_118.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
    local_178.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
         local_118.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
    local_178.codes.write_.shared_alloc_.direct_ptr =
         local_118.codes.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
      piVar1 = &local_138->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_138);
        operator_delete(pAVar4,0x48);
      }
    }
    pAVar4 = local_148;
    if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
      piVar1 = &local_148->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_148);
        operator_delete(pAVar4,0x48);
      }
    }
    Adj::~Adj(&local_178);
  }
  pAVar4 = local_68;
  if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
    piVar1 = &local_68->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_68);
      operator_delete(pAVar4,0x48);
    }
  }
  pAVar4 = local_78;
  if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
    piVar1 = &local_78->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_78);
      operator_delete(pAVar4,0x48);
    }
  }
  Adj::~Adj(&local_a8);
  local_128.shared_alloc_.alloc = local_188.shared_alloc_.alloc;
  local_128.shared_alloc_.direct_ptr = local_188.shared_alloc_.direct_ptr;
  if ((((ulong)local_188.shared_alloc_.alloc & 7) == 0 &&
       local_188.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_188.shared_alloc_.alloc)->use_count = (local_188.shared_alloc_.alloc)->use_count + -1;
    local_128.shared_alloc_.alloc = (Alloc *)((local_188.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_188.shared_alloc_.alloc = (Alloc *)0x0;
  local_188.shared_alloc_.direct_ptr = (void *)0x0;
  Read<signed_char>::Read((Read<signed_char> *)this,&local_128);
  pAVar4 = local_128.shared_alloc_.alloc;
  if (((ulong)local_128.shared_alloc_.alloc & 7) == 0 &&
      local_128.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_128.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_128.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
    }
  }
  pAVar4 = local_d8;
  if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
    piVar1 = &local_d8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d8);
      operator_delete(pAVar4,0x48);
    }
  }
  pAVar4 = local_e8;
  if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
    piVar1 = &local_e8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_e8);
      operator_delete(pAVar4,0x48);
    }
  }
  Adj::~Adj(&local_118);
  pAVar4 = local_188.shared_alloc_.alloc;
  pvVar8 = extraout_RDX;
  if (((ulong)local_188.shared_alloc_.alloc & 7) == 0 &&
      local_188.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_188.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_188.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
      pvVar8 = extraout_RDX_00;
    }
  }
  if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
    piVar1 = &local_b8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b8);
      operator_delete(local_b8,0x48);
      pvVar8 = extraout_RDX_01;
    }
  }
  RVar9.write_.shared_alloc_.direct_ptr = pvVar8;
  RVar9.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar9.write_.shared_alloc_;
}

Assistant:

Read<I8> get_curv_edge_vert_flips(
    Mesh* mesh, Adj curv_verts2edges, LOs edge2curv_edge) {
  auto in = get_curv_vert_edge_flips(curv_verts2edges, edge2curv_edge);
  auto out = Write<I8>(mesh->nedges() * 2, I8(0));
  auto ncurv_verts = curv_verts2edges.nnodes();
  auto f = OMEGA_H_LAMBDA(LO curv_vert) {
    for (auto ve = curv_verts2edges.a2ab[curv_vert];
         ve < curv_verts2edges.a2ab[curv_vert + 1]; ++ve) {
      auto e = curv_verts2edges.ab2b[ve];
      auto code = curv_verts2edges.codes[ve];
      auto eev = code_which_down(code);
      out[e * 2 + eev] = in[ve];
    }
  };
  parallel_for(ncurv_verts, f, "get_curv_edge_vert_flips");
  return out;
}